

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmbstr.c
# Opt level: O1

int prvTidytmbstrcasecmp(ctmbstr s1,ctmbstr s2)

{
  uint uVar1;
  uint uVar2;
  ctmbstr ptVar3;
  char cVar4;
  
  cVar4 = *s1;
  uVar1 = prvTidyToLower((int)cVar4);
  uVar2 = prvTidyToLower((int)*s2);
  ptVar3 = s2;
  if (uVar1 == uVar2) {
    do {
      if (cVar4 == '\0') {
        return 0;
      }
      s2 = ptVar3 + 1;
      cVar4 = s1[1];
      s1 = s1 + 1;
      uVar1 = prvTidyToLower((int)cVar4);
      uVar2 = prvTidyToLower((int)ptVar3[1]);
      ptVar3 = s2;
    } while (uVar1 == uVar2);
  }
  return (uint)(*s2 < *s1) * 2 + -1;
}

Assistant:

int TY_(tmbstrcasecmp)( ctmbstr s1, ctmbstr s2 )
{
    uint c;

    while (c = (uint)(*s1), TY_(ToLower)(c) == TY_(ToLower)((uint)(*s2)))
    {
        if (c == '\0')
            return 0;

        ++s1;
        ++s2;
    }

    return (*s1 > *s2 ? 1 : -1);
}